

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O3

bool __thiscall
glslang::TOutputTraverser::visitSwitch(TOutputTraverser *this,TVisit param_1,TIntermSwitch *node)

{
  TInfoSinkBase *this_00;
  int *piVar1;
  TInfoSink *infoSink;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  this_00 = &infoSink->debug;
  TInfoSinkBase::append(this_00,"switch");
  if (node->flatten == true) {
    TInfoSinkBase::append(this_00,": Flatten");
  }
  if (node->dontFlatten == true) {
    TInfoSinkBase::append(this_00,": DontFlatten");
  }
  TInfoSinkBase::append(this_00,"\n");
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::append(this_00,"condition\n");
  piVar1 = &(this->super_TIntermTraverser).depth;
  *piVar1 = *piVar1 + 1;
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])(node);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  iVar2 = (this->super_TIntermTraverser).depth + -1;
  (this->super_TIntermTraverser).depth = iVar2;
  OutputTreeText(infoSink,&node->super_TIntermNode,iVar2);
  TInfoSinkBase::append(this_00,"body\n");
  piVar1 = &(this->super_TIntermTraverser).depth;
  *piVar1 = *piVar1 + 1;
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var_00,iVar2),this);
  piVar1 = &(this->super_TIntermTraverser).depth;
  *piVar1 = *piVar1 + -1;
  return false;
}

Assistant:

bool TOutputTraverser::visitSwitch(TVisit /* visit */, TIntermSwitch* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);
    out.debug << "switch";

    if (node->getFlatten())
        out.debug << ": Flatten";
    if (node->getDontFlatten())
        out.debug << ": DontFlatten";
    out.debug << "\n";

    OutputTreeText(out, node, depth);
    out.debug << "condition\n";
    ++depth;
    node->getCondition()->traverse(this);

    --depth;
    OutputTreeText(out, node, depth);
    out.debug << "body\n";
    ++depth;
    node->getBody()->traverse(this);

    --depth;

    return false;
}